

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O1

bitstream * vs_new_decode(vs_type type,uint8_t *bytes,int bytesnum)

{
  bitstream *pbVar1;
  
  pbVar1 = (bitstream *)calloc(0x38,1);
  pbVar1->dir = VS_DECODE;
  pbVar1->type = type;
  pbVar1->bytes = bytes;
  pbVar1->bytesnum = bytesnum;
  pbVar1->bitpos = 7;
  return pbVar1;
}

Assistant:

struct bitstream *vs_new_decode(enum vs_type type, uint8_t *bytes, int bytesnum) {
	struct bitstream *res = calloc(sizeof *res, 1);
	res->dir = VS_DECODE;
	res->type = type;
	res->bytes = bytes;
	res->bytesnum = bytesnum;
	res->bitpos = 7;
	return res;
}